

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_resets(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *pAVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  RESET_DATA *pRVar5;
  MOB_INDEX_DATA *pMVar6;
  OBJ_INDEX_DATA *pOVar7;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var8;
  RESET_DATA *prev;
  int iReset;
  int insert_loc;
  ROOM_INDEX_DATA *pRoom;
  RESET_DATA *pReset;
  char arg7 [4608];
  char arg6 [4608];
  char arg5 [4608];
  char arg4 [4608];
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffff8178;
  ROOM_INDEX_DATA *pRVar9;
  flag_type *in_stack_ffffffffffff8180;
  undefined4 in_stack_ffffffffffff8188;
  int in_stack_ffffffffffff818c;
  int in_stack_ffffffffffff8190;
  int in_stack_ffffffffffff8194;
  short local_7e64;
  short sVar10;
  undefined4 in_stack_ffffffffffff81a0;
  undefined4 in_stack_ffffffffffff81a4;
  char *in_stack_ffffffffffff81a8;
  RESET_DATA *local_7e38;
  int local_7e30;
  RESET_DATA *local_7e20;
  char local_7e18 [4504];
  char *in_stack_ffffffffffff9380;
  flag_type *in_stack_ffffffffffff9388;
  char local_6c18 [4608];
  char local_5a18 [72];
  CHAR_DATA *in_stack_ffffffffffffa630;
  char local_4818 [4608];
  char local_3618 [4608];
  char local_2418 [4608];
  char local_1218 [4616];
  char *local_10;
  CHAR_DATA *local_8;
  
  local_7e20 = (RESET_DATA *)0x0;
  local_8 = in_RDI;
  bVar2 = check_security(in_stack_ffffffffffff8178);
  if (bVar2) {
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    local_10 = one_argument((char *)in_stack_ffffffffffff8180,(char *)in_stack_ffffffffffff8178);
    bVar2 = is_switched(local_8);
    if ((bVar2) ||
       ((((local_8->in_room->area->security < local_8->pcdata->security ||
          (pcVar4 = strstr(local_8->in_room->area->builders,local_8->name), pcVar4 == (char *)0x0))
         && (local_8->pcdata->security <= local_8->in_room->area->security)) &&
        (pcVar4 = strstr(local_8->in_room->area->builders,"All"), pcVar4 == (char *)0x0)))) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
    }
    else {
      if (local_1218[0] == '\0') {
        if (local_8->in_room->reset_first == (RESET_DATA *)0x0) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
        }
        else {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
          display_resets(in_stack_ffffffffffffa630);
        }
      }
      bVar2 = is_number((char *)in_stack_ffffffffffff8178);
      if (bVar2) {
        pRVar9 = local_8->in_room;
        bVar2 = str_cmp(local_2418,"delete");
        if (bVar2) {
          bVar2 = str_cmp(local_2418,"door");
          if (bVar2) {
            bVar2 = str_cmp(local_2418,"follow");
            if (bVar2) {
              bVar2 = str_cmp(local_2418,"mob");
              if (((!bVar2) && (bVar2 = is_number((char *)in_stack_ffffffffffff8178), bVar2)) ||
                 ((bVar2 = str_cmp(local_2418,"obj"), !bVar2 &&
                  (bVar2 = is_number((char *)in_stack_ffffffffffff8178), bVar2)))) {
                bVar2 = str_cmp(local_2418,"mob");
                if (bVar2) {
                  bVar2 = str_cmp(local_2418,"obj");
                  if (!bVar2) {
                    local_7e20 = new_reset_data();
                    atoi(local_3618);
                    pOVar7 = get_obj_index(in_stack_ffffffffffff818c);
                    if (pOVar7 == (OBJ_INDEX_DATA *)0x0) {
                      send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,
                                                    in_stack_ffffffffffff8190),
                                   (CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                      return;
                    }
                    iVar3 = atoi(local_3618);
                    local_7e20->arg1 = (short)iVar3;
                    bVar2 = str_prefix(in_stack_ffffffffffff81a8,
                                       (char *)CONCAT44(in_stack_ffffffffffff81a4,
                                                        in_stack_ffffffffffff81a0));
                    if (bVar2) {
                      bVar2 = str_cmp(local_4818,"room");
                      if (bVar2) {
                        iVar3 = flag_value(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380);
                        if (iVar3 == -99) {
                          send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,
                                                        in_stack_ffffffffffff8190),
                                       (CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188)
                                      );
                          return;
                        }
                        local_7e20 = new_reset_data();
                        atoi(local_3618);
                        pOVar7 = get_obj_index(in_stack_ffffffffffff818c);
                        if (pOVar7 == (OBJ_INDEX_DATA *)0x0) {
                          send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,
                                                        in_stack_ffffffffffff8190),
                                       (CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188)
                                      );
                          return;
                        }
                        iVar3 = atoi(local_3618);
                        local_7e20->arg1 = (short)iVar3;
                        iVar3 = flag_value(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380);
                        local_7e20->arg3 = (short)iVar3;
                        if (local_7e20->arg3 == -1) {
                          local_7e20->command = 'G';
                        }
                        else {
                          local_7e20->command = 'E';
                        }
                      }
                      else {
                        local_7e20 = new_reset_data();
                        local_7e20->command = 'O';
                        atoi(local_3618);
                        pOVar7 = get_obj_index(in_stack_ffffffffffff818c);
                        if (pOVar7 == (OBJ_INDEX_DATA *)0x0) {
                          send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,
                                                        in_stack_ffffffffffff8190),
                                       (CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188)
                                      );
                          return;
                        }
                        iVar3 = atoi(local_3618);
                        local_7e20->arg1 = (short)iVar3;
                        local_7e20->arg2 = 0;
                        local_7e20->arg3 = local_8->in_room->vnum;
                        local_7e20->arg4 = 0;
                      }
                    }
                    else {
                      local_7e20->command = 'P';
                      local_7e20->arg2 = 0;
                      bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                      if (bVar2) {
                        atoi(local_5a18);
                      }
                      pOVar7 = get_obj_index(in_stack_ffffffffffff818c);
                      if (pOVar7->item_type != 0xf) {
                        send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,
                                                      in_stack_ffffffffffff8190),
                                     (CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                        return;
                      }
                      bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                      if (bVar2) {
                        in_stack_ffffffffffff8194 = atoi(local_6c18);
                      }
                      else {
                        in_stack_ffffffffffff8194 = 1;
                      }
                      local_7e20->arg2 = (short)in_stack_ffffffffffff8194;
                      bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                      if (bVar2) {
                        in_stack_ffffffffffff8190 = atoi(local_5a18);
                      }
                      else {
                        in_stack_ffffffffffff8190 = 1;
                      }
                      local_7e20->arg3 = (short)in_stack_ffffffffffff8190;
                      bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                      if (bVar2) {
                        in_stack_ffffffffffff818c = atoi(local_7e18);
                      }
                      else {
                        in_stack_ffffffffffff818c = 1;
                      }
                      local_7e20->arg4 = (short)in_stack_ffffffffffff818c;
                    }
                  }
                }
                else {
                  local_7e20 = new_reset_data();
                  local_7e20->command = 'M';
                  bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                  if (bVar2) {
                    atoi(local_3618);
                  }
                  pMVar6 = get_mob_index(in_stack_ffffffffffff818c);
                  if (pMVar6 == (MOB_INDEX_DATA *)0x0) {
                    send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,
                                                  in_stack_ffffffffffff8190),
                                 (CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                    return;
                  }
                  iVar3 = atoi(local_3618);
                  local_7e20->arg1 = (short)iVar3;
                  bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                  if (bVar2) {
                    iVar3 = atoi(local_4818);
                    sVar10 = (short)iVar3;
                  }
                  else {
                    sVar10 = 1;
                  }
                  local_7e20->arg2 = sVar10;
                  local_7e20->arg3 = local_8->in_room->vnum;
                  bVar2 = is_number((char *)in_stack_ffffffffffff8178);
                  if (bVar2) {
                    iVar3 = atoi(local_5a18);
                    local_7e64 = (short)iVar3;
                  }
                  else {
                    local_7e64 = 1;
                  }
                  local_7e20->arg4 = local_7e64;
                }
                pRVar9 = local_8->in_room;
                iVar3 = atoi(local_1218);
                add_reset(pRVar9,local_7e20,iVar3);
                _Var8 = std::pow<int,int>(0,0x77108a);
                pAVar1 = local_8->in_room->area;
                pAVar1->area_flags[0] = (long)_Var8 | pAVar1->area_flags[0];
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
              }
              else {
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
              }
            }
            else {
              pRVar5 = new_reset_data();
              pRVar5->command = 'F';
              atoi(local_3618);
              pMVar6 = get_mob_index(in_stack_ffffffffffff818c);
              if (pMVar6 == (MOB_INDEX_DATA *)0x0) {
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
              }
              else {
                atoi(local_4818);
                pMVar6 = get_mob_index(in_stack_ffffffffffff818c);
                if (pMVar6 == (MOB_INDEX_DATA *)0x0) {
                  send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190)
                               ,(CHAR_DATA *)
                                CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                }
                else {
                  iVar3 = atoi(local_3618);
                  pRVar5->arg1 = (short)iVar3;
                  iVar3 = atoi(local_4818);
                  pRVar5->arg2 = (short)iVar3;
                  pRVar5->arg3 = 0;
                  pRVar5->arg4 = 0;
                  pRVar9 = local_8->in_room;
                  iVar3 = atoi(local_1218);
                  add_reset(pRVar9,pRVar5,iVar3);
                  _Var8 = std::pow<int,int>(0,0x770b1f);
                  pAVar1 = local_8->in_room->area;
                  pAVar1->area_flags[0] = (long)_Var8 | pAVar1->area_flags[0];
                  send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190)
                               ,(CHAR_DATA *)
                                CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                }
              }
            }
          }
          else {
            pRVar5 = new_reset_data();
            pRVar5->command = 'D';
            iVar3 = flag_lookup((char *)CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188
                                                ),in_stack_ffffffffffff8180);
            if (iVar3 == -99) {
              send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
            }
            else {
              pRVar5->arg1 = pRVar9->vnum;
              iVar3 = flag_lookup((char *)CONCAT44(in_stack_ffffffffffff818c,
                                                   in_stack_ffffffffffff8188),
                                  in_stack_ffffffffffff8180);
              pRVar5->arg2 = (short)iVar3;
              bVar2 = str_cmp(local_4818,"closed");
              if (bVar2) {
                bVar2 = str_cmp(local_4818,"locked");
                if (bVar2) {
                  send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190)
                               ,(CHAR_DATA *)
                                CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                  return;
                }
                pRVar5->arg3 = 2;
              }
              else {
                pRVar5->arg3 = 1;
              }
              pRVar5->arg4 = 0;
              pRVar9 = local_8->in_room;
              iVar3 = atoi(local_1218);
              add_reset(pRVar9,pRVar5,iVar3);
              _Var8 = std::pow<int,int>(0,0x7709be);
              pAVar1 = local_8->in_room->area;
              pAVar1->area_flags[0] = (long)_Var8 | pAVar1->area_flags[0];
              send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
            }
          }
        }
        else {
          iVar3 = atoi(local_1218);
          if (local_8->in_room->reset_first == (RESET_DATA *)0x0) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188))
            ;
          }
          else {
            if (iVar3 + -1 < 1) {
              local_7e20 = pRVar9->reset_first;
              pRVar9->reset_first = pRVar9->reset_first->next;
              if (pRVar9->reset_first == (RESET_DATA *)0x0) {
                pRVar9->reset_last = (RESET_DATA *)0x0;
              }
            }
            else {
              local_7e30 = 0;
              local_7e38 = (RESET_DATA *)0x0;
              local_7e20 = pRVar9->reset_first;
              while ((local_7e20 != (RESET_DATA *)0x0 &&
                     (local_7e30 = local_7e30 + 1, local_7e30 != iVar3))) {
                local_7e38 = local_7e20;
                local_7e20 = local_7e20->next;
              }
              if (local_7e20 == (RESET_DATA *)0x0) {
                send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188));
                return;
              }
              if (local_7e38 == (RESET_DATA *)0x0) {
                pRVar9->reset_first = pRVar9->reset_first->next;
              }
              else {
                local_7e38->next = local_7e38->next->next;
              }
              pRVar9->reset_last = pRVar9->reset_first;
              while (pRVar9->reset_last->next != (RESET_DATA *)0x0) {
                pRVar9->reset_last = pRVar9->reset_last->next;
              }
            }
            free_reset_data(local_7e20);
            send_to_char((char *)CONCAT44(in_stack_ffffffffffff8194,in_stack_ffffffffffff8190),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff818c,in_stack_ffffffffffff8188))
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_resets(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	char arg4[MAX_INPUT_LENGTH];
	char arg5[MAX_INPUT_LENGTH];
	char arg6[MAX_INPUT_LENGTH];
	char arg7[MAX_INPUT_LENGTH];
	RESET_DATA *pReset = nullptr;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);
	argument = one_argument(argument, arg4);
	argument = one_argument(argument, arg5);
	argument = one_argument(argument, arg6);
	argument = one_argument(argument, arg7);

	if (!IS_BUILDER(ch, ch->in_room->area))
	{
		send_to_char("Resets: Invalid security for editing this area.\n\r", ch);
		return;
	}

	/*
	 * Display resets in current room.
	 * -------------------------------
	 */
	if (arg1[0] == '\0')
	{
		if (ch->in_room->reset_first)
		{
			send_to_char("Resets: M = mobile, R = room, O = object, "\
						 "P = pet, S = shopkeeper\n\r", ch);
			display_resets(ch);
		}
		else
		{
			send_to_char("No resets in this room.\n\r", ch);
		}
	}

	/*
	 * Take index number and search for commands.
	 * ------------------------------------------
	 */
	if (is_number(arg1))
	{
		ROOM_INDEX_DATA *pRoom = ch->in_room;

		/*
		 * Delete a reset.
		 * ---------------
		 */
		if (!str_cmp(arg2, "delete"))
		{
			int insert_loc = atoi(arg1);

			if (!ch->in_room->reset_first)
			{
				send_to_char("No resets in this area.\n\r", ch);
				return;
			}

			if (insert_loc - 1 <= 0)
			{
				pReset = pRoom->reset_first;
				pRoom->reset_first = pRoom->reset_first->next;

				if (!pRoom->reset_first)
					pRoom->reset_last = nullptr;
			}
			else
			{
				int iReset = 0;
				RESET_DATA *prev = nullptr;

				for (pReset = pRoom->reset_first; pReset; pReset = pReset->next)
				{
					if (++iReset == insert_loc)
						break;
					prev = pReset;
				}

				if (!pReset)
				{
					send_to_char("Reset not found.\n\r", ch);
					return;
				}

				if (prev)
					prev->next = prev->next->next;
				else
					pRoom->reset_first = pRoom->reset_first->next;

				for (pRoom->reset_last = pRoom->reset_first;
					pRoom->reset_last->next;
					pRoom->reset_last = pRoom->reset_last->next);
			}

			free_reset_data(pReset);
			send_to_char("Reset deleted.\n\r", ch);
		}
		else if ((!str_cmp(arg2, "door"))) /* Door reset. */
		{
			pReset = new_reset_data();
			pReset->command = 'D';

			if (flag_lookup(arg3, direction_table) == NO_FLAG)
			{
				send_to_char("No exit that direction.\n\r", ch);
				return;
			}

			pReset->arg1 = pRoom->vnum;
			pReset->arg2 = flag_lookup(arg3, direction_table);

			if (!str_cmp(arg4, "closed"))
			{
				pReset->arg3 = 1;
			}
			else if (!str_cmp(arg4, "locked"))
			{
				pReset->arg3 = 2;
			}
			else
			{
				send_to_char("Not a possible state.\n\r", ch);
				return;
			}

			pReset->arg4 = 0;

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else if (!str_cmp(arg2, "follow")) /* Follow resets */
		{
			pReset = new_reset_data();
			pReset->command = 'F';

			if (get_mob_index(atoi(arg3)) == nullptr)
			{
				send_to_char("That is not a valid follower vnum.\n\r", ch);
				return;
			}

			if (get_mob_index(atoi(arg4)) == nullptr)
			{
				send_to_char("That is not a valid leader vnum.\n\r", ch);
				return;
			}

			pReset->arg1 = atoi(arg3);
			pReset->arg2 = atoi(arg4);
			pReset->arg3 = 0;
			pReset->arg4 = 0;

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else if ((!str_cmp(arg2, "mob") && is_number(arg3)) || (!str_cmp(arg2, "obj") && is_number(arg3))) /* Add a reset. */
		{
			if (!str_cmp(arg2, "mob")) /* Check for Mobile reset. */
			{
				pReset = new_reset_data();
				pReset->command = 'M';

				if (get_mob_index(is_number(arg3) ? atoi(arg3) : 1) == nullptr)
				{
					send_to_char("Mob does not exist.\n\r", ch);
					return;
				}

				pReset->arg1 = atoi(arg3);
				pReset->arg2 = is_number(arg4) ? atoi(arg4) : 1; /* Max # */
				pReset->arg3 = ch->in_room->vnum;
				pReset->arg4 = is_number(arg5) ? atoi(arg5) : 1; /* Min # */
			}
			else if (!str_cmp(arg2, "obj")) /* Check for Object reset. */
			{
				pReset = new_reset_data();
				if (get_obj_index(atoi(arg3)) == nullptr)
					return send_to_char("That object does not exist.\n\r", ch);
				pReset->arg1 = atoi(arg3);

				if (!str_prefix(arg4, "inside")) /* Inside another object. */
				{
					pReset->command = 'P';
					pReset->arg2 = 0;
					if ((get_obj_index(is_number(arg5) ? atoi(arg5) : 1))->item_type != ITEM_CONTAINER)
					{
						send_to_char("Object2 is not a container\n\r", ch);
						return;
					}
					pReset->arg2 = is_number(arg6) ? atoi(arg6) : 1;
					pReset->arg3 = is_number(arg5) ? atoi(arg5) : 1;
					pReset->arg4 = is_number(arg7) ? atoi(arg7) : 1;
				}
				else if (!str_cmp(arg4, "room")) /* Inside the room. */
				{
					pReset = new_reset_data();
					pReset->command = 'O';

					if (get_obj_index(atoi(arg3)) == nullptr)
					{
						send_to_char("Vnum does not exist.\n\r", ch);
						return;
					}

					pReset->arg1 = atoi(arg3);
					pReset->arg2 = 0;
					pReset->arg3 = ch->in_room->vnum;
					pReset->arg4 = 0;
				}
				else /* Into a Mobile's inventory. */
				{
					if (flag_value(wear_loc_flags, arg4) == NO_FLAG)
					{
						send_to_char("Resets: '? wear-loc'\n\r", ch);
						return;
					}

					pReset = new_reset_data();

					if (get_obj_index(atoi(arg3)) == nullptr)
					{
						send_to_char("Vnum does not exist.\n\r", ch);
						return;
					}

					pReset->arg1 = atoi(arg3);
					pReset->arg3 = flag_value(wear_loc_flags, arg4);

					if (pReset->arg3 == WEAR_NONE)
						pReset->command = 'G';
					else
						pReset->command = 'E';
				}
			}

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else
		{
			send_to_char("Syntax: RESET <number> OBJ <vnum> <wear_loc>\n\r", ch);
			send_to_char("        RESET <number> OBJ <vnum> inside <vnum> [limit] [count]\n\r", ch);
			send_to_char("        RESET <number> OBJ <vnum> room\n\r", ch);
			send_to_char("        RESET <number> MOB <vnum> [max # area] [max # room]\n\r", ch);
			send_to_char("        RESET <number> DELETE\n\r", ch);
			send_to_char("        RESET <number> DOOR <direction> <closed/locked>\n\r", ch);
			send_to_char("        RESET <number> FOLLOW <follower vnum> <leader vnum>\n\r", ch);
		}
	}
}